

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createShaderDefaultOutputGroup(TestContext *testCtx)

{
  deUint32 dVar1;
  TestCaseGroup *pTVar2;
  mapped_type *pmVar3;
  SpvAsmComputeShaderCase *this;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  NumberType type;
  int iVar5;
  TestNode *this_00;
  allocator<char> local_1f5;
  float local_1f4;
  TestContext *local_1f0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> subGroup;
  string local_1d8;
  size_type *local_1b8;
  undefined8 local_1b0;
  key_type local_1a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  Random rnd;
  string description;
  string typeName;
  undefined1 local_f8 [88];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
  local_a0 [24];
  int local_88 [20];
  code *local_38;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_1f0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"shader_default_output","Test shader default output.");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  dVar1 = deStringHash((pTVar2->super_TestNode).m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  type = TYPE_INT;
  uVar4 = extraout_RDX;
  do {
    pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    if (type == TYPE_END) {
      group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
           = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar2;
    }
    getNumberTypeName_abi_cxx11_(&typeName,(SpirVAssembly *)(ulong)type,(NumberType)uVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "Test the OpVariable initializer with ",&typeName);
    std::operator+(&description,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"."
                  );
    std::__cxx11::string::~string((string *)local_f8);
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,local_1f0,typeName._M_dataplus._M_p,description._M_dataplus._M_p);
    subGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar2;
    iVar5 = 2;
    while( true ) {
      pTVar2 = subGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      if (iVar5 == 0) break;
      ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_f8);
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88[0] = 1;
      local_88[1] = 1;
      local_88[2] = 1;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (type == TYPE_INT) {
        dVar1 = deRandom_getUint32(&rnd.m_rnd);
        createCompositeBuffer<int>((SpirVAssembly *)&local_1d8,dVar1);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)(local_f8 + 0x40),(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8
                  );
        de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                  ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
        createCompositeBuffer<int>((SpirVAssembly *)&local_1d8,dVar1);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
        de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                  ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
        numberToString<int>(&local_1d8,dVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"constValue",&local_1f5);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&params,&local_1a8);
        std::__cxx11::string::_M_assign((string *)pmVar3);
LAB_005774a4:
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      else {
        if (type == TYPE_UINT) {
          dVar1 = deRandom_getUint32(&rnd.m_rnd);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_1d8,dVar1);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)(local_f8 + 0x40),
                     (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_1d8,dVar1);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          numberToString<unsigned_int>(&local_1d8,dVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"constValue",&local_1f5);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_1a8);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          goto LAB_005774a4;
        }
        if (type == TYPE_FLOAT) {
          local_1f4 = deRandom_getFloat(&rnd.m_rnd);
          createCompositeBuffer<float>((SpirVAssembly *)&local_1d8,local_1f4);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)(local_f8 + 0x40),
                     (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          createCompositeBuffer<float>((SpirVAssembly *)&local_1d8,local_1f4);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_1d8);
          local_38 = compareFloats;
          numberToString<float>(&local_1d8,local_1f4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"constValue",&local_1f5);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&params,&local_1a8);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          goto LAB_005774a4;
        }
      }
      if (iVar5 == 2) {
        specializeDefaultOutputShaderTemplate(&local_1d8,type,&params);
        std::__cxx11::string::_M_assign((string *)local_f8);
        std::__cxx11::string::~string((string *)&local_1d8);
        this_00 = &(subGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr)->super_TestNode;
        this = (SpvAsmComputeShaderCase *)operator_new(0x140);
        SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                  (this,local_1f0,"initialized","OpVariable initializer tests.",
                   (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      }
      else {
        local_1d8._M_dataplus._M_p = (pointer)0x0;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity = 0;
        local_1d8.field_2._8_8_ = &local_1d8._M_string_length;
        local_1b0 = 0;
        local_1b8 = (size_type *)local_1d8.field_2._8_8_;
        specializeDefaultOutputShaderTemplate
                  (&local_1a8,type,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_1d8);
        std::__cxx11::string::_M_assign((string *)local_f8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_1d8);
        this_00 = &(subGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr)->super_TestNode;
        local_38 = passthruVerify;
        this = (SpvAsmComputeShaderCase *)operator_new(0x140);
        SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                  (this,local_1f0,"uninitialized","OpVariable initializer tests.",
                   (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      }
      tcu::TestNode::addChild(this_00,(TestNode *)this);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)local_f8);
      iVar5 = iVar5 + -1;
    }
    subGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&subGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&typeName);
    type = type + TYPE_UINT;
    uVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createShaderDefaultOutputGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "shader_default_output", "Test shader default output."));
	de::Random						rnd		(deStringHash(group->getName()));

	for (int type = TYPE_INT; type != TYPE_END; ++type)
	{
		NumberType						numberType	= NumberType(type);
		const string					typeName	= getNumberTypeName(numberType);
		const string					description	= "Test the OpVariable initializer with " + typeName + ".";
		de::MovePtr<tcu::TestCaseGroup>	subGroup	(new tcu::TestCaseGroup(testCtx, typeName.c_str(), description.c_str()));

		// 2 similar subcases (initialized and uninitialized)
		for (int subCase = 0; subCase < 2; ++subCase)
		{
			ComputeShaderSpec spec;
			spec.numWorkGroups = IVec3(1, 1, 1);

			map<string, string>				params;

			switch (numberType)
			{
				case TYPE_INT:
				{
					deInt32 number = getInt(rnd);
					spec.inputs.push_back(createCompositeBuffer<deInt32>(number));
					spec.outputs.push_back(createCompositeBuffer<deInt32>(number));
					params["constValue"] = numberToString(number);
					break;
				}
				case TYPE_UINT:
				{
					deUint32 number = rnd.getUint32();
					spec.inputs.push_back(createCompositeBuffer<deUint32>(number));
					spec.outputs.push_back(createCompositeBuffer<deUint32>(number));
					params["constValue"] = numberToString(number);
					break;
				}
				case TYPE_FLOAT:
				{
					float number = rnd.getFloat();
					spec.inputs.push_back(createCompositeBuffer<float>(number));
					spec.outputs.push_back(createCompositeBuffer<float>(number));
					spec.verifyIO = &compareFloats;
					params["constValue"] = numberToString(number);
					break;
				}
				default:
					DE_ASSERT(false);
			}

			// Initialized subcase
			if (!subCase)
			{
				spec.assembly = specializeDefaultOutputShaderTemplate(numberType, params);
				subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, "initialized", "OpVariable initializer tests.", spec));
			}
			// Uninitialized subcase
			else
			{
				spec.assembly = specializeDefaultOutputShaderTemplate(numberType);
				spec.verifyIO = &passthruVerify;
				subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, "uninitialized", "OpVariable initializer tests.", spec));
			}
		}
		group->addChild(subGroup.release());
	}
	return group.release();
}